

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTexture.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar3;
  size_t j;
  long lVar4;
  Vec3f VVar5;
  string model_path;
  string texture_path;
  vector<int,_std::allocator<int>_> face;
  TGAImage texture;
  TGAImage framebuffer;
  Vec2f uv [3];
  TinyRender render;
  Vec3f triangle [3];
  Model model;
  long *local_1c0 [2];
  long local_1b0 [2];
  long *local_1a0 [2];
  long local_190 [2];
  vector<int,_std::allocator<int>_> local_180;
  TGAImage local_168;
  TGAImage local_150;
  Vec2f local_138;
  Vec2f local_130;
  Vec2f local_128;
  TinyRender local_120;
  Vec3f local_108 [4];
  Model local_d8;
  
  TRM::TGAImage::TGAImage(&local_150,800,600,3);
  local_d8.verts_.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_1_ = 4;
  local_d8.verts_.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xff000000;
  TRM::TGAImage::clearColor(&local_150,(TGAColor *)&local_d8);
  local_120._vptr_TinyRender = (_func_int **)&PTR__TinyRender_00109d80;
  local_120.mImage = (TGAImage *)0x0;
  local_120.mZBuffer = (float *)0x0;
  TRM::TinyRender::attachBuffer(&local_120,&local_150);
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c0,ASSETS_ROOT_abi_cxx11_._M_dataplus._M_p,
             ASSETS_ROOT_abi_cxx11_._M_dataplus._M_p + ASSETS_ROOT_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_1c0);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,ASSETS_ROOT_abi_cxx11_._M_dataplus._M_p,
             ASSETS_ROOT_abi_cxx11_._M_dataplus._M_p + ASSETS_ROOT_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_1a0);
  TRM::Model::Model(&local_d8,(char *)local_1c0[0]);
  TRM::TGAImage::TGAImage(&local_168);
  TRM::TGAImage::read_tga_file(&local_168,(char *)local_1a0[0]);
  TRM::TGAImage::flip_vertically(&local_168);
  uVar2 = 0;
  while( true ) {
    iVar1 = TRM::Model::nfaces(&local_d8);
    if ((ulong)(long)iVar1 <= uVar2) break;
    iVar1 = (int)uVar2;
    TRM::Model::face(&local_180,&local_d8,iVar1);
    paVar3 = &local_108[0].field_2;
    lVar4 = 0;
    do {
      VVar5 = TRM::Model::vert(&local_d8,
                               local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar4]);
      paVar3[-2].z = (VVar5.field_0.x + 1.0) * 800.0 * 0.5;
      paVar3[-1].z = (VVar5.field_1.y + 1.0) * 600.0 * 0.5;
      *paVar3 = VVar5.field_2;
      lVar4 = lVar4 + 1;
      paVar3 = paVar3 + 3;
    } while (lVar4 != 3);
    local_138 = TRM::Model::uv(&local_d8,iVar1,0);
    local_130 = TRM::Model::uv(&local_d8,iVar1,1);
    local_128 = TRM::Model::uv(&local_d8,iVar1,2);
    TRM::TinyRender::triangle(&local_120,local_108,&local_138,&local_168);
    if (local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar2 = uVar2 + 1;
  }
  TRM::TGAImage::flip_vertically(&local_150);
  TRM::TGAImage::write_png_stb(&local_150,"framebuffer.png");
  TRM::TGAImage::~TGAImage(&local_168);
  TRM::Model::~Model(&local_d8);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  TRM::TGAImage::~TGAImage(&local_150);
  return 0;
}

Assistant:

int main(int argc, const char** argv) {
  TGAImage framebuffer(WIDTH, HEIGHT, TGAImage::RGB);
  framebuffer.clearColor(TGAColor(0, 0, 0));

  TinyRender render;
  render.attachBuffer(&framebuffer);

  std::string model_path = ASSETS_ROOT + "/african_head.obj";
  std::string texture_path = ASSETS_ROOT + "/african_head_diffuse.tga";

  Model model(model_path.c_str());

  Vec3f light_dir;
  light_dir[0] = 0;
  light_dir[1] = 0;
  light_dir[2] = -1.f;

  TGAImage texture;
  texture.read_tga_file(texture_path.c_str());
  texture.flip_vertically();

  /** draw all vertex triangle ***/
  for (size_t i = 0; i < model.nfaces(); i++) {
    std::vector<int> face = model.face(i);
    Vec3f triangle[3];
    Vec3f vectors[3];
    for (size_t j = 0; j < 3; j++) {
      Vec3f c = model.vert(face[j]);
      vectors[j] = c;
      c[0] = (c[0] + 1.f) * WIDTH / 2.f;
      c[1] = (c[1] + 1.f) * HEIGHT / 2.f;
      triangle[j][0] = c[0];
      triangle[j][1] = c[1];
      triangle[j][2] = c[2];
    }

    Vec2f uv[] = {model.uv(i, 0), model.uv(i, 1), model.uv(i, 2)};
    render.triangle(triangle, uv, &texture);
  }

  framebuffer.flip_vertically();
  framebuffer.write_png_stb("framebuffer.png");

  return 0;
}